

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O2

int WebRtcIsac_DecodeLpc(Bitstr *streamdata,double *LPCCoef_lo,double *LPCCoef_hi)

{
  int iVar1;
  double lars [120];
  
  iVar1 = WebRtcIsac_DecodeLpcCoef(streamdata,lars);
  if (iVar1 < 0) {
    iVar1 = -0x1a18;
  }
  else {
    WebRtcIsac_Lar2Poly(lars,LPCCoef_lo,0xc,LPCCoef_hi,6,6);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int WebRtcIsac_DecodeLpc(Bitstr* streamdata, double* LPCCoef_lo,
                         double* LPCCoef_hi) {
  double lars[KLT_ORDER_GAIN + KLT_ORDER_SHAPE];
  int err;

  err = WebRtcIsac_DecodeLpcCoef(streamdata, lars);
  if (err < 0) {
    return -ISAC_RANGE_ERROR_DECODE_LPC;
  }
  WebRtcIsac_Lar2Poly(lars, LPCCoef_lo, ORDERLO, LPCCoef_hi, ORDERHI,
                      SUBFRAMES);
  return 0;
}